

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O3

void ImageAlphaMask(Image *image,Image alphaMask)

{
  void *__ptr;
  Image image_00;
  void *pvVar1;
  int i;
  uint uVar2;
  ulong uVar3;
  char *text;
  uint uVar4;
  long lVar5;
  undefined8 unaff_retaddr;
  Image local_30;
  
  if ((image->width != alphaMask.width) || (image->height != alphaMask.height)) {
    text = "IMAGE: Alpha mask must be same size as image";
LAB_0013d74e:
    TraceLog(4,text);
    return;
  }
  if (10 < image->format) {
    text = "IMAGE: Alpha mask can not be applied to compressed data formats";
    goto LAB_0013d74e;
  }
  image_00._8_8_ = alphaMask.data;
  image_00.data = (void *)unaff_retaddr;
  image_00.mipmaps = alphaMask.width;
  image_00.format = alphaMask.height;
  ImageCopy(image_00);
  if (local_30.format != 1) {
    ImageFormat(&local_30,1);
  }
  if (image->format != 7) {
    if (image->format == 1) {
      lVar5 = (long)image->height * (long)image->width;
      pvVar1 = malloc(lVar5 * 2);
      uVar4 = (uint)lVar5;
      uVar2 = local_30.height * local_30.width;
      if (local_30.height * local_30.width < (int)uVar4) {
        uVar2 = uVar4;
      }
      __ptr = image->data;
      if (0 < (int)uVar2) {
        uVar3 = 0;
        do {
          *(undefined1 *)((long)pvVar1 + uVar3 * 2) = *(undefined1 *)((long)__ptr + uVar3);
          *(undefined1 *)((long)pvVar1 + uVar3 * 2 + 1) =
               *(undefined1 *)((long)local_30.data + uVar3);
          uVar3 = uVar3 + 1;
        } while (uVar2 != uVar3);
      }
      free(__ptr);
      image->data = pvVar1;
      image->format = 2;
      goto LAB_0013d808;
    }
    ImageFormat(image,7);
  }
  for (lVar5 = 0;
      (lVar5 < (long)local_30.height * (long)local_30.width ||
      (lVar5 < (long)image->height * (long)image->width)); lVar5 = lVar5 + 1) {
    *(undefined1 *)((long)image->data + lVar5 * 4 + 3) =
         *(undefined1 *)((long)local_30.data + lVar5);
  }
LAB_0013d808:
  free(local_30.data);
  return;
}

Assistant:

void ImageAlphaMask(Image *image, Image alphaMask)
{
    if ((image->width != alphaMask.width) || (image->height != alphaMask.height))
    {
        TRACELOG(LOG_WARNING, "IMAGE: Alpha mask must be same size as image");
    }
    else if (image->format >= PIXELFORMAT_COMPRESSED_DXT1_RGB)
    {
        TRACELOG(LOG_WARNING, "IMAGE: Alpha mask can not be applied to compressed data formats");
    }
    else
    {
        // Force mask to be Grayscale
        Image mask = ImageCopy(alphaMask);
        if (mask.format != PIXELFORMAT_UNCOMPRESSED_GRAYSCALE) ImageFormat(&mask, PIXELFORMAT_UNCOMPRESSED_GRAYSCALE);

        // In case image is only grayscale, we just add alpha channel
        if (image->format == PIXELFORMAT_UNCOMPRESSED_GRAYSCALE)
        {
            unsigned char *data = (unsigned char *)RL_MALLOC(image->width*image->height*2);

            // Apply alpha mask to alpha channel
            for (int i = 0, k = 0; (i < mask.width*mask.height) || (i < image->width*image->height); i++, k += 2)
            {
                data[k] = ((unsigned char *)image->data)[i];
                data[k + 1] = ((unsigned char *)mask.data)[i];
            }

            RL_FREE(image->data);
            image->data = data;
            image->format = PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA;
        }
        else
        {
            // Convert image to RGBA
            if (image->format != PIXELFORMAT_UNCOMPRESSED_R8G8B8A8) ImageFormat(image, PIXELFORMAT_UNCOMPRESSED_R8G8B8A8);

            // Apply alpha mask to alpha channel
            for (int i = 0, k = 3; (i < mask.width*mask.height) || (i < image->width*image->height); i++, k += 4)
            {
                ((unsigned char *)image->data)[k] = ((unsigned char *)mask.data)[i];
            }
        }

        UnloadImage(mask);
    }
}